

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

CURLcode Curl_unencode_deflate_write(connectdata *conn,SingleRequest *k,ssize_t nread)

{
  z_stream *z;
  CURLcode CVar1;
  int iVar2;
  
  if (k->zlib_init == ZLIB_UNINIT) {
    z = &k->z;
    (k->z).adler = 0;
    (k->z).reserved = 0;
    (k->z).opaque = (voidpf)0x0;
    *(undefined8 *)&(k->z).data_type = 0;
    (k->z).zalloc = (alloc_func)0x0;
    (k->z).zfree = (free_func)0x0;
    (k->z).msg = (char *)0x0;
    (k->z).state = (internal_state *)0x0;
    *(undefined8 *)&(k->z).avail_out = 0;
    (k->z).total_out = 0;
    (k->z).total_in = 0;
    (k->z).next_out = (Bytef *)0x0;
    z->next_in = (Bytef *)0x0;
    *(undefined8 *)&(k->z).avail_in = 0;
    (k->z).zalloc = zalloc_cb;
    (k->z).zfree = zfree_cb;
    iVar2 = inflateInit_(z,"1.2.11",0x70);
    if (iVar2 != 0) {
      process_zlib_error(conn,z);
      return CURLE_BAD_CONTENT_ENCODING;
    }
    k->zlib_init = ZLIB_INIT;
  }
  (k->z).next_in = (Bytef *)k->str;
  (k->z).avail_in = (uInt)nread;
  CVar1 = inflate_stream(conn,k);
  return CVar1;
}

Assistant:

CURLcode
Curl_unencode_deflate_write(struct connectdata *conn,
                            struct SingleRequest *k,
                            ssize_t nread)
{
  z_stream *z = &k->z;          /* zlib state structure */

  /* Initialize zlib? */
  if(k->zlib_init == ZLIB_UNINIT) {
    memset(z, 0, sizeof(z_stream));
    z->zalloc = (alloc_func)zalloc_cb;
    z->zfree = (free_func)zfree_cb;

    if(inflateInit(z) != Z_OK)
      return process_zlib_error(conn, z);
    k->zlib_init = ZLIB_INIT;
  }

  /* Set the compressed input when this function is called */
  z->next_in = (Bytef *)k->str;
  z->avail_in = (uInt)nread;

  /* Now uncompress the data */
  return inflate_stream(conn, k);
}